

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplayingHammerer.cpp
# Opt level: O1

void __thiscall
ReplayingHammerer::run_refresh_alignment_experiment
          (ReplayingHammerer *this,PatternAddressMapper *mapper)

{
  CodeJitter *code_jitter;
  string *__k;
  iterator iVar1;
  size_t sVar2;
  string local_70;
  string local_50;
  
  code_jitter = PatternAddressMapper::get_code_jitter(mapper);
  __k = PatternAddressMapper::get_instance_id_abi_cxx11_(mapper);
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->map_mapping_id_to_pattern)._M_h,__k);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_true>
      ._M_cur != (__node_type *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Hammering pattern for 10x100M activations.","");
    Logger::log_info(&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar2 = hammer_pattern(this,&this->params,code_jitter,
                           (HammeringPattern *)
                           ((long)iVar1.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_true>
                                  ._M_cur + 0x28),mapper,code_jitter->flushing_strategy,
                           code_jitter->fencing_strategy,10,code_jitter->num_aggs_for_sync,100000000
                           ,false,code_jitter->pattern_sync_each_ref,false,false,false,false,true);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"total bit flips = %d","");
    format_string<unsigned_long>(&local_50,&local_70,sVar2);
    Logger::log_data(&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"Hammering pattern for 10x10M activations.","");
    Logger::log_info(&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    sVar2 = hammer_pattern(this,&this->params,code_jitter,
                           (HammeringPattern *)
                           ((long)iVar1.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HammeringPattern>,_true>
                                  ._M_cur + 0x28),mapper,code_jitter->flushing_strategy,
                           code_jitter->fencing_strategy,10,code_jitter->num_aggs_for_sync,10000000,
                           false,code_jitter->pattern_sync_each_ref,false,false,false,false,true);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"total bit flips = %d","");
    format_string<unsigned_long>(&local_50,&local_70,sVar2);
    Logger::log_data(&local_50,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

[[maybe_unused]] void ReplayingHammerer::run_refresh_alignment_experiment(PatternAddressMapper &mapper) {
  auto &cj = mapper.get_code_jitter();
  auto &patt = map_mapping_id_to_pattern.at(mapper.get_instance_id());

  Logger::log_info("Hammering pattern for 10x100M activations.");
  size_t num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy, 10,
      cj.num_aggs_for_sync, M(100), false, cj.pattern_sync_each_ref, false, false, false, false, true);
  Logger::log_data(format_string("total bit flips = %d", num_bit_flips));

  Logger::log_info("Hammering pattern for 10x10M activations.");
  num_bit_flips = hammer_pattern(params, cj, patt, mapper, cj.flushing_strategy, cj.fencing_strategy, 10,
      cj.num_aggs_for_sync, M(10), false, cj.pattern_sync_each_ref, false, false, false, false, true);
  Logger::log_data(format_string("total bit flips = %d", num_bit_flips));
}